

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusextratypes.h
# Opt level: O2

bool operator==(QDBusObjectPath *lhs,QDBusObjectPath *rhs)

{
  bool bVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_50;
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d = (lhs->m_path).d.d;
  local_38.ptr = (lhs->m_path).d.ptr;
  local_38.size = (lhs->m_path).d.size;
  if (local_38.d != (Data *)0x0) {
    LOCK();
    ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_50.d = (rhs->m_path).d.d;
  local_50.ptr = (rhs->m_path).d.ptr;
  local_50.size = (rhs->m_path).d.size;
  if (local_50.d != (Data *)0x0) {
    LOCK();
    ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  bVar1 = comparesEqual((QString *)&local_38,(QString *)&local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

inline bool operator==(const QDBusObjectPath &lhs, const QDBusObjectPath &rhs)
{ return lhs.path() == rhs.path(); }